

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

string * __thiscall
cfd::core::
JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Serialize(JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  bool bVar1;
  reference pbVar2;
  value_type *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end3;
  iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  bool is_first;
  string item_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string *result;
  string *this_00;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  _Self local_98;
  _Self local_90;
  undefined1 *local_88;
  byte local_7d;
  string local_70 [32];
  reference local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  value_type *local_38;
  undefined1 local_30 [24];
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  byte bVar4;
  
  uVar3 = 0;
  this_00 = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x64852a);
  local_38 = in_RSI;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&in_RSI->_M_string_length);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38->_M_string_length);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
    ConvertToString<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar3,in_stack_ffffffffffffffe8));
    ::std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff60,in_RSI);
    ::std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_40);
  }
  ::std::__cxx11::string::operator=((string *)this_00,"[");
  local_7d = 1;
  local_88 = local_30;
  local_90._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
  local_98._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  while( true ) {
    bVar1 = ::std::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    pbVar2 = ::std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x648653);
    if ((local_7d & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)this_00,",");
    }
    ::std::__cxx11::string::operator+=((string *)this_00,(string *)pbVar2);
    local_7d = 0;
    ::std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_90);
  }
  ::std::__cxx11::string::operator+=((string *)this_00,"]");
  bVar4 = 1;
  ::std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x6486bb);
  if ((bVar4 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this_00);
  }
  return in_RDI;
}

Assistant:

virtual std::string Serialize() const {
    std::string result;
    std::list<std::string> str_list;
    for (const auto& element : *this) {
      std::string item_result = ConvertToString(element);
      str_list.push_back(item_result);
    }

    result = "[";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "]";

    return result;
  }